

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

shared_ptr<helics::CoreFactory::CoreBuilder> *
helics::CoreFactory::MasterCoreBuilder::getBuilder(int code)

{
  int iVar1;
  element_type *peVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer ptVar5;
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *psVar6;
  pointer ptVar7;
  HelicsException *this;
  bool bVar8;
  string_view message;
  
  psVar6 = instance();
  peVar2 = (psVar6->
           super___shared_ptr<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ptVar3 = (peVar2->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar4 = (peVar2->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = ptVar3 == ptVar4;
  ptVar7 = ptVar3;
  if (!bVar8) {
    iVar1 = (ptVar3->
            super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>
            ).super__Head_base<0UL,_int,_false>._M_head_impl;
    ptVar5 = ptVar3;
    while (ptVar7 = ptVar5, iVar1 != code) {
      bVar8 = ptVar5 + 1 == ptVar4;
      ptVar7 = ptVar3;
      if (bVar8) break;
      iVar1 = ptVar5[1].
              super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>
              .super__Head_base<0UL,_int,_false>._M_head_impl;
      ptVar5 = ptVar5 + 1;
    }
  }
  if (bVar8) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    message._M_str = "core type is not available";
    message._M_len = 0x1a;
    HelicsException::HelicsException(this,message);
    __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
  }
  return (shared_ptr<helics::CoreFactory::CoreBuilder> *)ptVar7;
}

Assistant:

static const std::shared_ptr<CoreBuilder>& getBuilder(int code)
    {
        for (auto& builder : instance()->builders) {
            if (std::get<0>(builder) == code) {
                return std::get<2>(builder);
            }
        }
        throw(HelicsException("core type is not available"));
    }